

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void update_nst(int (*array) [8] [5] [5] [5] [5])

{
  int iVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  int (*paaiVar5) [5] [5];
  int (*paaaiVar6) [5] [5] [5];
  int (*paaiVar7) [5] [5];
  int iVar8;
  int *piVar9;
  int *piVar10;
  int (*paaaaiVar11) [5] [5] [5] [5];
  int iVar12;
  int (*paaaaiVar13) [5] [5] [5] [5];
  int (*paaaaiVar14) [5] [5] [5] [5];
  int (*paaaaiVar15) [5] [5] [5] [5];
  int (*paaaaiVar16) [5] [5] [5] [5];
  int *piVar17;
  int (*paiVar18) [5];
  int (*paiVar19) [5];
  int *piVar20;
  int *piVar21;
  int iVar22;
  int *piVar23;
  int iVar24;
  int *piVar25;
  int (*paaaiVar26) [5] [5] [5];
  long lVar27;
  int (*paaaaiVar28) [5] [5] [5] [5];
  int *piVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int (*paaiVar34) [5] [5];
  int (*paaaaiVar35) [5] [5] [5] [5];
  int *piVar36;
  int (*paaaaiVar37) [5] [5] [5] [5];
  long lVar38;
  int *piVar39;
  int (*paaaaiVar40) [5] [5] [5] [5];
  int (*paaaaiVar41) [5] [5] [5] [5];
  int *piVar42;
  int (*local_f0) [5] [5];
  int *local_c0;
  int (*local_b8) [5];
  int *local_a8;
  int *local_a0;
  int *local_90;
  int *local_78;
  int *local_70;
  int *local_68;
  int (*local_60) [5];
  int (*local_58) [5];
  int *local_50;
  int *local_48;
  
  local_a0 = array[1][1][1][1][1] + 1;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    local_90 = local_a0;
    for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
      piVar21 = local_90;
      piVar23 = local_90;
      for (lVar32 = 1; lVar32 != 5; lVar32 = lVar32 + 1) {
        piVar20 = piVar21;
        piVar10 = piVar23;
        piVar4 = piVar21;
        for (lVar38 = 1; lVar38 != 5; lVar38 = lVar38 + 1) {
          piVar9 = piVar20;
          piVar25 = piVar10;
          piVar29 = piVar4;
          piVar42 = piVar20;
          for (lVar27 = 1; lVar27 != 5; lVar27 = lVar27 + 1) {
            iVar8 = -10000000;
            iVar30 = -10000000;
            iVar12 = -10000000;
            iVar22 = -10000000;
            piVar17 = piVar29;
            piVar36 = piVar25;
            piVar39 = piVar42;
            for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
              if (iVar8 <= piVar9[lVar33]) {
                iVar8 = piVar9[lVar33];
              }
              if (iVar30 <= *piVar39) {
                iVar30 = *piVar39;
              }
              if (iVar12 <= *piVar17) {
                iVar12 = *piVar17;
              }
              if (iVar22 <= *piVar36) {
                iVar22 = *piVar36;
              }
              piVar39 = piVar39 + 5;
              piVar17 = piVar17 + 0x19;
              piVar36 = piVar36 + 0x7d;
            }
            array[lVar2][lVar3][lVar32][lVar38][lVar27][0] = iVar8;
            array[lVar2][lVar3][lVar32][lVar38][0][lVar27] = iVar30;
            array[lVar2][lVar3][lVar32][0][lVar38][lVar27] = iVar12;
            array[lVar2][lVar3][0][lVar32][lVar38][lVar27] = iVar22;
            piVar9 = piVar9 + 5;
            piVar42 = piVar42 + 1;
            piVar29 = piVar29 + 1;
            piVar25 = piVar25 + 1;
          }
          piVar20 = piVar20 + 0x19;
          piVar4 = piVar4 + 5;
          piVar10 = piVar10 + 5;
        }
        piVar21 = piVar21 + 0x7d;
        piVar23 = piVar23 + 0x19;
      }
      local_90 = local_90 + 0x271;
    }
    local_a0 = local_a0 + 5000;
  }
  local_60 = array[1][1][1][1] + 1;
  local_68 = array[1][1][0][1][1] + 1;
  local_70 = array[1][1][1][0][1] + 1;
  local_78 = array[1][1][1][1][0] + 1;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    local_a8 = local_78;
    local_48 = local_70;
    local_50 = local_68;
    local_58 = local_60;
    for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
      paiVar18 = local_58;
      piVar21 = local_48;
      piVar23 = local_50;
      piVar20 = local_48;
      piVar10 = local_a8;
      for (lVar32 = 1; lVar32 != 5; lVar32 = lVar32 + 1) {
        piVar4 = piVar23;
        piVar9 = piVar21;
        paiVar19 = paiVar18;
        piVar25 = piVar20;
        piVar29 = piVar23;
        piVar42 = piVar10;
        for (lVar38 = 1; lVar38 != 5; lVar38 = lVar38 + 1) {
          iVar8 = -10000000;
          lVar27 = 0;
          lVar33 = 0;
          iVar30 = -10000000;
          iVar12 = -10000000;
          iVar22 = -10000000;
          iVar31 = -10000000;
          iVar24 = -10000000;
          piVar17 = piVar25;
          piVar36 = piVar42;
          while( true ) {
            if (lVar33 == 0x50) break;
            iVar1 = *(int *)((long)*paiVar19 + lVar33);
            if (iVar8 <= iVar1) {
              iVar8 = iVar1;
            }
            if (iVar30 <= *piVar36) {
              iVar30 = *piVar36;
            }
            if (iVar12 <= *piVar17) {
              iVar12 = *piVar17;
            }
            if (iVar22 <= *(int *)((long)piVar4 + lVar27)) {
              iVar22 = *(int *)((long)piVar4 + lVar27);
            }
            if (iVar31 <= *(int *)((long)piVar29 + lVar33)) {
              iVar31 = *(int *)((long)piVar29 + lVar33);
            }
            if (iVar24 <= *(int *)((long)piVar9 + lVar27)) {
              iVar24 = *(int *)((long)piVar9 + lVar27);
            }
            lVar33 = lVar33 + 0x14;
            lVar27 = lVar27 + 4;
            piVar36 = piVar36 + 0x19;
            piVar17 = piVar17 + 0x7d;
          }
          array[lVar2][lVar3][lVar32][lVar38][0][0] = iVar8;
          array[lVar2][lVar3][lVar32][0][0][lVar38] = iVar30;
          array[lVar2][lVar3][0][0][lVar32][lVar38] = iVar12;
          array[lVar2][lVar3][lVar32][0][lVar38][0] = iVar24;
          array[lVar2][lVar3][0][lVar32][0][lVar38] = iVar31;
          array[lVar2][lVar3][0][lVar32][lVar38][0] = iVar22;
          paiVar19 = paiVar19 + 5;
          piVar4 = piVar4 + 5;
          piVar29 = piVar29 + 1;
          piVar9 = piVar9 + 5;
          piVar42 = piVar42 + 1;
          piVar25 = piVar25 + 1;
        }
        paiVar18 = paiVar18 + 0x19;
        piVar23 = piVar23 + 0x19;
        piVar21 = piVar21 + 0x7d;
        piVar10 = piVar10 + 0x7d;
        piVar20 = piVar20 + 5;
      }
      local_58 = local_58 + 0x7d;
      local_50 = local_50 + 0x271;
      local_48 = local_48 + 0x271;
      local_a8 = local_a8 + 0x271;
    }
    local_60 = local_60 + 1000;
    local_68 = local_68 + 5000;
    local_70 = local_70 + 5000;
    local_78 = local_78 + 5000;
  }
  local_f0 = array[1][1][1] + 1;
  local_b8 = array[1][1][0][1] + 1;
  local_c0 = array[1][1][0][0][1] + 1;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    paaiVar7 = local_f0;
    piVar21 = local_c0;
    paiVar18 = local_b8;
    for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
      paaiVar5 = paaiVar7;
      piVar23 = piVar21;
      piVar20 = piVar21;
      paiVar19 = paiVar18;
      for (lVar32 = 1; lVar32 != 5; lVar32 = lVar32 + 1) {
        iVar8 = -10000000;
        iVar30 = -10000000;
        iVar22 = -10000000;
        iVar12 = -10000000;
        piVar10 = piVar23;
        paaiVar34 = paaiVar5;
        for (lVar38 = 0; lVar38 != 0x50; lVar38 = lVar38 + 0x14) {
          iVar31 = (*paaiVar34)[0][0];
          if (iVar8 <= iVar31) {
            iVar8 = iVar31;
          }
          iVar31 = *(int *)((long)*paiVar19 + lVar38);
          if (iVar30 <= iVar31) {
            iVar30 = iVar31;
          }
          if (iVar22 <= *piVar10) {
            iVar22 = *piVar10;
          }
          if (iVar12 <= *(int *)((long)piVar20 + lVar38)) {
            iVar12 = *(int *)((long)piVar20 + lVar38);
          }
          paaiVar34 = paaiVar34 + 1;
          piVar10 = piVar10 + 1;
        }
        array[lVar2][lVar3][lVar32][0][0][0] = iVar8;
        array[lVar2][lVar3][0][lVar32][0][0] = iVar30;
        array[lVar2][lVar3][0][0][lVar32][0] = iVar22;
        array[lVar2][lVar3][0][0][0][lVar32] = iVar12;
        paaiVar5 = paaiVar5 + 5;
        paiVar19 = paiVar19 + 5;
        piVar23 = piVar23 + 5;
        piVar20 = piVar20 + 1;
      }
      paaiVar7 = paaiVar7 + 0x19;
      paiVar18 = paiVar18 + 0x7d;
      piVar21 = piVar21 + 0x271;
    }
    local_f0 = local_f0 + 200;
    local_b8 = local_b8 + 1000;
    local_c0 = local_c0 + 5000;
  }
  paaaiVar6 = array[1][1] + 1;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    paaaiVar26 = paaaiVar6;
    for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
      iVar8 = -10000000;
      for (lVar32 = 0; lVar32 != 2000; lVar32 = lVar32 + 500) {
        iVar30 = *(int *)((long)(*paaaiVar26)[0][0] + lVar32);
        if (iVar8 <= iVar30) {
          iVar8 = iVar30;
        }
      }
      array[lVar2][lVar3][0][0][0][0] = iVar8;
      paaaiVar26 = paaaiVar26 + 5;
    }
    paaaiVar6 = paaaiVar6 + 0x28;
  }
  paaaaiVar13 = array[1] + 1;
  paaaaiVar11 = paaaaiVar13;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    paaaaiVar14 = paaaaiVar13;
    paaaaiVar28 = paaaaiVar11;
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      paaaaiVar15 = paaaaiVar14;
      paaaaiVar40 = paaaaiVar28;
      for (lVar32 = 0; lVar32 != 5; lVar32 = lVar32 + 1) {
        paaaaiVar16 = paaaaiVar15;
        paaaaiVar41 = paaaaiVar40;
        for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
          paaaaiVar35 = paaaaiVar16;
          paaaaiVar37 = paaaaiVar41;
          for (lVar27 = 0; lVar27 != 5; lVar27 = lVar27 + 1) {
            iVar8 = -10000000;
            iVar30 = -10000000;
            for (lVar33 = 0; lVar33 != 15000; lVar33 = lVar33 + 0x9c4) {
              iVar12 = *(int *)((long)(*paaaaiVar37)[0][0][0] + lVar33);
              if (iVar8 <= iVar12) {
                iVar8 = iVar12;
              }
              iVar12 = (*paaaaiVar35)[0][0][0][lVar33 * 2];
              if (iVar30 <= iVar12) {
                iVar30 = iVar12;
              }
            }
            array[lVar2][7][lVar3][lVar32][lVar38][lVar27] = iVar8;
            array[7][lVar2][lVar3][lVar32][lVar38][lVar27] = iVar30;
            paaaaiVar37 = (int (*) [5] [5] [5] [5])((*paaaaiVar37)[0][0][0] + 1);
            paaaaiVar35 = (int (*) [5] [5] [5] [5])((*paaaaiVar35)[0][0][0] + 1);
          }
          paaaaiVar41 = (int (*) [5] [5] [5] [5])((*paaaaiVar41)[0][0] + 1);
          paaaaiVar16 = (int (*) [5] [5] [5] [5])((*paaaaiVar16)[0][0] + 1);
        }
        paaaaiVar40 = (int (*) [5] [5] [5] [5])((*paaaaiVar40)[0] + 1);
        paaaaiVar15 = (int (*) [5] [5] [5] [5])((*paaaaiVar15)[0] + 1);
      }
      paaaaiVar28 = (int (*) [5] [5] [5] [5])(*paaaaiVar28 + 1);
      paaaaiVar14 = (int (*) [5] [5] [5] [5])(*paaaaiVar14 + 1);
    }
    paaaaiVar11 = paaaaiVar11 + 8;
    paaaaiVar13 = paaaaiVar13 + 1;
  }
  paaaaiVar13 = array[7] + 1;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    paaaaiVar11 = paaaaiVar13;
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      paaaaiVar14 = paaaaiVar11;
      for (lVar32 = 0; lVar32 != 5; lVar32 = lVar32 + 1) {
        paaaaiVar28 = paaaaiVar14;
        for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
          iVar8 = -10000000;
          for (lVar27 = 0; lVar27 != 15000; lVar27 = lVar27 + 0x9c4) {
            iVar30 = *(int *)((long)(*paaaaiVar28)[0][0][0] + lVar27);
            if (iVar8 <= iVar30) {
              iVar8 = iVar30;
            }
          }
          array[7][7][lVar2][lVar3][lVar32][lVar38] = iVar8;
          paaaaiVar28 = (int (*) [5] [5] [5] [5])((*paaaaiVar28)[0][0][0] + 1);
        }
        paaaaiVar14 = (int (*) [5] [5] [5] [5])((*paaaaiVar14)[0][0] + 1);
      }
      paaaaiVar11 = (int (*) [5] [5] [5] [5])((*paaaaiVar11)[0] + 1);
    }
    paaaaiVar13 = (int (*) [5] [5] [5] [5])(*paaaaiVar13 + 1);
  }
  return;
}

Assistant:

PRIVATE void
update_nst(int array[NBPAIRS + 1][NBPAIRS + 1][5][5][5][5])
{
  int i, j, k, l, m, n;
  int max, max2, max3, max4, max5, max6;

  /* get maxima for one nonstandard nucleotide */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          for (m = 1; m < 5; m++) {
            max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
            for (n = 1; n < 5; n++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[i][j][k][l][n][m]);
              max3  = MAX2(max3, array[i][j][k][n][l][m]);
              max4  = MAX2(max4, array[i][j][n][k][l][m]);
            }
            array[i][j][k][l][m][0] = max;
            array[i][j][k][l][0][m] = max2;
            array[i][j][k][0][l][m] = max3;
            array[i][j][0][k][l][m] = max4;
          }
        }
      }
    }
  }
  /* get maxima for two nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          max = max2 = max3 = max4 = max5 = max6 = -INF; /* max of {CGAU} */
          for (m = 1; m < 5; m++) {
            max   = MAX2(max, array[i][j][k][l][m][0]);
            max2  = MAX2(max2, array[i][j][k][m][0][l]);
            max3  = MAX2(max3, array[i][j][m][0][k][l]);
            max4  = MAX2(max4, array[i][j][0][k][l][m]);
            max5  = MAX2(max5, array[i][j][0][k][m][l]);
            max6  = MAX2(max6, array[i][j][k][0][l][m]);
          }
          array[i][j][k][l][0][0] = max;
          array[i][j][k][0][0][l] = max2;
          array[i][j][0][0][k][l] = max3;
          array[i][j][k][0][l][0] = max6;
          array[i][j][0][k][0][l] = max5;
          array[i][j][0][k][l][0] = max4;
        }
      }
    }
  }
  /* get maxima for three nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
        for (l = 1; l < 5; l++) {
          /* should be arbitrary where index l resides in last 3 possible locations */
          max   = MAX2(max, array[i][j][k][l][0][0]);
          max2  = MAX2(max2, array[i][j][0][k][l][0]);
          max3  = MAX2(max3, array[i][j][0][0][k][l]);
          max4  = MAX2(max4, array[i][j][0][0][l][k]);
        }
        array[i][j][k][0][0][0] = max;
        array[i][j][0][k][0][0] = max2;
        array[i][j][0][0][k][0] = max3;
        array[i][j][0][0][0][k] = max4;
      }
    }
  }
  /* get maxima for 4 nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      max = -INF; /* max of {CGAU} */
      for (k = 1; k < 5; k++)
        max = MAX2(max, array[i][j][k][0][0][0]);
      array[i][j][0][0][0][0] = max;
    }
  }

  /*
   * now compute contributions for nonstandard base pairs ...
   * first, 1 nonstandard bp
   */
  for (i = 1; i < NBPAIRS; i++) {
    for (k = 0; k < 5; k++) {
      for (l = 0; l < 5; l++) {
        for (m = 0; m < 5; m++) {
          for (n = 0; n < 5; n++) {
            max = max2 = -INF;
            for (j = 1; j < NBPAIRS; j++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[j][i][k][l][m][n]);
            }
            array[i][NBPAIRS][k][l][m][n] = max;
            array[NBPAIRS][i][k][l][m][n] = max2;
          }
        }
      }
    }
  }

  /* now 2 nst base pairs */
  for (k = 0; k < 5; k++) {
    for (l = 0; l < 5; l++) {
      for (m = 0; m < 5; m++) {
        for (n = 0; n < 5; n++) {
          max = -INF;
          for (j = 1; j < NBPAIRS; j++)
            max = MAX2(max, array[NBPAIRS][j][k][l][m][n]);
          array[NBPAIRS][NBPAIRS][k][l][m][n] = max;
        }
      }
    }
  }
}